

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testNNValidatorBadOutput2(void)

{
  pointer pcVar1;
  bool bVar2;
  ResultReason RVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *this;
  ArrayFeatureType *this_00;
  TypeUnion this_01;
  Type *this_02;
  LayerUnion this_03;
  ostream *poVar6;
  int iVar7;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  this = pTVar5->type_;
  if (this == (FeatureType *)0x0) {
    this = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(this);
    pTVar5->type_ = this;
  }
  if (this->_oneof_case_[0] == 5) {
    this_00 = (this->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(this);
    this->_oneof_case_[0] = 5;
    this_00 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_00);
    (this->Type_).multiarraytype_ = this_00;
  }
  iVar7 = (this_00->shape_).current_size_;
  if (iVar7 == (this_00->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this_00->shape_,iVar7 + 1);
    iVar7 = (this_00->shape_).current_size_;
  }
  (this_00->shape_).current_size_ = iVar7 + 1;
  ((this_00->shape_).rep_)->elements[iVar7] = 1;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this_01.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_01.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this_01.pipelineclassifier_;
  }
  this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_02,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_02,"output");
  if (this_02->_oneof_case_[0] == 0x8c) {
    this_03 = this_02->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_02);
    this_02->_oneof_case_[0] = 0x8c;
    this_03.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_03.innerproduct_);
    (this_02->layer_).innerproduct_ = (InnerProductLayerParams *)this_03;
  }
  (this_03.innerproduct_)->hasbias_ = false;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar2 = CoreML::Result::good((Result *)local_78);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!(((res)).good())",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
    RVar3 = CoreML::Result::reason((Result *)local_78);
    iVar7 = 0;
    if (RVar3 == MODEL_OUTPUT_TYPE_INVALID) goto LAB_00158bd6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"((ResultReason::MODEL_OUTPUT_TYPE_INVALID)) == ((res).reason())",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  std::ostream::put((char)poVar6);
  iVar7 = 1;
  std::ostream::flush();
LAB_00158bd6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return iVar7;
}

Assistant:

int testNNValidatorBadOutput2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD_WITH_REASON(res, ResultReason::MODEL_OUTPUT_TYPE_INVALID);

    return 0;
}